

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  ColourImpl *pCVar1;
  ostream *poVar2;
  long lVar3;
  char local_1a [2];
  
  local_1a[0] = '\n';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,local_1a,1);
  lVar3 = 0x4f;
  do {
    std::ostream::put((char)poVar2);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  local_1a[1] = 10;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1a + 1,1);
  pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0x17);
  poVar2 = (ostream *)
           std::ostream::write((char *)poVar2,
                               (long)(this->super_StreamingReporterBase).currentTestRunInfo.name.
                                     m_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is a Catch2 v",0xe);
  libraryVersion();
  operator<<(poVar2,&libraryVersion::version);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," host application.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Run with -? for options\n\n",0x19);
  (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0);
  this->m_testRunInfoPrinted = true;
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    m_stream << '\n'
             << lineOfChars( '~' ) << '\n'
             << m_colour->guardColour( Colour::SecondaryText )
             << currentTestRunInfo.name << " is a Catch2 v" << libraryVersion()
             << " host application.\n"
             << "Run with -? for options\n\n";

    m_testRunInfoPrinted = true;
}